

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendApi.cpp
# Opt level: O0

void CheckIsExecutable(RecyclableObject *function,JavascriptMethod entrypoint)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  TypeId TVar4;
  int iVar5;
  ScriptContext *this;
  JavascriptFunction *pJVar6;
  ThreadContext *pTVar7;
  undefined4 *puVar8;
  TypeId typeId;
  ScriptContext *scriptContext;
  JavascriptMethod entrypoint_local;
  RecyclableObject *function_local;
  TypeId typeId_1;
  
  this = Js::RecyclableObject::GetScriptContext(function);
  bVar2 = Js::VarIs<Js::JavascriptFunction,Js::RecyclableObject>(function);
  if (bVar2) {
    pJVar6 = Js::VarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
    iVar5 = (*(pJVar6->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6e])();
    if (iVar5 != 0) goto LAB_004c1c1a;
  }
  bVar2 = Js::CrossSite::IsThunk(entrypoint);
  if ((!bVar2) &&
     ((((bVar2 = Js::VarIs<Js::JavascriptFunction,Js::RecyclableObject>(function), bVar2 ||
        (BVar3 = Js::RecyclableObject::IsExternal(function), BVar3 == 0)) ||
       (bVar2 = Js::JavascriptConversion::IsCallable(function), !bVar2)) &&
      (bVar2 = Js::ScriptContext::IsActuallyClosed(this), bVar2)))) {
    pTVar7 = Js::ScriptContext::GetThreadContext(this);
    bVar2 = ThreadContext::IsScriptActive(pTVar7);
    if ((!bVar2) || (bVar2 = Js::JavascriptConversion::IsCallable(function), bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendApi.cpp"
                         ,0x99,
                         "((Js::VarIs<Js::JavascriptFunction>(function) && Js::VarTo<Js::JavascriptFunction>(function)->IsExternalFunction()) || Js::CrossSite::IsThunk(entrypoint) || (!Js::VarIs<Js::JavascriptFunction>(function) && function->IsExternal() && Js::JavascriptConversion::IsCallable(function)) || !scriptContext->IsActuallyClosed() || (scriptContext->GetThreadContext()->IsScriptActive() && !Js::JavascriptConversion::IsCallable(function)))"
                         ,"Can\'t call function when the script context is closed");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
LAB_004c1c1a:
  pTVar7 = Js::ScriptContext::GetThreadContext(this);
  bVar2 = ThreadContext::IsScriptActive(pTVar7);
  if ((!bVar2) && (BVar3 = Js::RecyclableObject::IsExternal(function), BVar3 == 0)) {
    if (function == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    TVar4 = Js::RecyclableObject::GetTypeId(function);
    if ((0x57 < (int)TVar4) && (BVar3 = Js::RecyclableObject::IsExternal(function), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/JavascriptOperators.inl"
                         ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                         "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if (TVar4 == TypeIds_HostDispatch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendApi.cpp"
                         ,0xa7,"(false)",
                         "Has to go through CallRootFunction to start calling Javascript function");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    else if (TVar4 == TypeIds_Function) {
      iVar5 = (*(function->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x6e])();
      if ((iVar5 == 0) &&
         (iVar5 = (*(function->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x6f])(), iVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendApi.cpp"
                           ,0xb5,"(false)",
                           "Has to go through CallRootFunction to start calling Javascript function"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendApi.cpp"
                         ,0xba,"(false)",
                         "Has to go through CallRootFunction to start calling Javascript function");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  return;
}

Assistant:

void CheckIsExecutable(Js::RecyclableObject * function, Js::JavascriptMethod entrypoint)
{
    Js::ScriptContext * scriptContext = function->GetScriptContext();
    // it's easy to call the default entry point from RecyclableObject.
    AssertMsg((Js::VarIs<Js::JavascriptFunction>(function) && Js::VarTo<Js::JavascriptFunction>(function)->IsExternalFunction())
        || Js::CrossSite::IsThunk(entrypoint)
        // External object with entrypoint
        || (!Js::VarIs<Js::JavascriptFunction>(function)
            && function->IsExternal()
            && Js::JavascriptConversion::IsCallable(function))
        || !scriptContext->IsActuallyClosed()
        || (scriptContext->GetThreadContext()->IsScriptActive() && !Js::JavascriptConversion::IsCallable(function)),
        "Can't call function when the script context is closed");

    if (scriptContext->GetThreadContext()->IsScriptActive())
    {
        return;
    }
    if (function->IsExternal())
    {
        return;
    }

    Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(function);
    if (typeId == Js::TypeIds_HostDispatch)
    {
        AssertMsg(false, "Has to go through CallRootFunction to start calling Javascript function");
    }
    else if (typeId == Js::TypeId::TypeIds_Function)
    {
        if (((Js::JavascriptFunction*)function)->IsExternalFunction())
        {
            return;
        }
        else if (((Js::JavascriptFunction*)function)->IsWinRTFunction())
        {
            return;
        }
        else
        {
            AssertMsg(false, "Has to go through CallRootFunction to start calling Javascript function");
        }
    }
    else
    {
        AssertMsg(false, "Has to go through CallRootFunction to start calling Javascript function");
    }
}